

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

void __thiscall wabt::interp::Store::Mark(Store *this,Ref ref)

{
  int iVar1;
  _Bit_type *p_Var2;
  ulong uVar3;
  Object *pOVar4;
  Ref RVar5;
  ulong uVar6;
  size_t index;
  
  RVar5.index = ref.index + 0x3f;
  if (-1 < (long)ref.index) {
    RVar5.index = ref.index;
  }
  p_Var2 = (this->gc_context_).marks.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar6 = (ulong)((ref.index & 0x800000000000003f) < 0x8000000000000001);
  uVar3 = p_Var2[((long)RVar5.index >> 6) + uVar6 + 0xffffffffffffffff];
  if ((uVar3 >> (ref.index & 0x3f) & 1) == 0) {
    p_Var2[((long)RVar5.index >> 6) + uVar6 + 0xffffffffffffffff] =
         uVar3 | 1L << ((byte)ref.index & 0x3f);
    iVar1 = (this->gc_context_).call_depth;
    if (iVar1 < 10) {
      (this->gc_context_).call_depth = iVar1 + 1;
      pOVar4 = (this->objects_).list_.
               super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
               _M_impl.super__Vector_impl_data._M_start[ref.index];
      if (((ulong)pOVar4 & 1) != 0) {
        __assert_fail("IsUsed(index)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                      ,0xe6,
                      "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
                     );
      }
      (*pOVar4->_vptr_Object[2])(pOVar4,this);
      (this->gc_context_).call_depth = (this->gc_context_).call_depth + -1;
    }
    else {
      Mark();
    }
  }
  return;
}

Assistant:

void Store::Mark(Ref ref) {
  size_t index = ref.index;

  if (gc_context_.marks[index])
    return;

  gc_context_.marks[index] = true;

  if (WABT_UNLIKELY(gc_context_.call_depth >= max_call_depth)) {
    gc_context_.untraced_objects.push_back(index);
    return;
  }

  gc_context_.call_depth++;
  objects_.Get(index)->Mark(*this);
  gc_context_.call_depth--;
}